

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimd_p.h
# Opt level: O0

uint64_t qCpuFeatures(void)

{
  unsigned_long uVar1;
  quint64 features;
  atomic<unsigned_long> *in_stack_00000008;
  
  uVar1 = std::atomic_load_explicit<unsigned_long>(in_stack_00000008,features._4_4_);
  return uVar1;
}

Assistant:

static inline uint64_t qCpuFeatures()
{
#ifdef QT_BOOTSTRAPPED
    return qCompilerCpuFeatures;    // no detection
#else
    quint64 features = atomic_load_explicit(QT_MANGLE_NAMESPACE(qt_cpu_features), memory_order_relaxed);
    if (!QT_SUPPORTS_INIT_PRIORITY) {
        if (Q_UNLIKELY(features == 0))
            features = QT_MANGLE_NAMESPACE(qDetectCpuFeatures)();
    }
    return features;
#endif
}